

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backed_block.cpp
# Opt level: O0

int backed_block_add_file(backed_block_list *bbl,char *filename,int64_t offset,uint len,uint block)

{
  backed_block *new_bb;
  char *pcVar1;
  uint in_ECX;
  int64_t in_RDX;
  char *in_RSI;
  uint in_R8D;
  backed_block *bb;
  int local_4;
  
  new_bb = (backed_block *)calloc(1,0x28);
  if (new_bb == (backed_block *)0x0) {
    local_4 = -0xc;
  }
  else {
    new_bb->block = in_R8D;
    new_bb->len = in_ECX;
    new_bb->type = BACKED_BLOCK_FILE;
    pcVar1 = strdup(in_RSI);
    (new_bb->field_3).file.filename = pcVar1;
    (new_bb->field_3).file.offset = in_RDX;
    new_bb->next = (backed_block *)0x0;
    local_4 = queue_bb((backed_block_list *)CONCAT44(in_ECX,in_R8D),new_bb);
  }
  return local_4;
}

Assistant:

int backed_block_add_file(struct backed_block_list* bbl, const char* filename, int64_t offset,
                          unsigned int len, unsigned int block) {
  struct backed_block* bb = reinterpret_cast<backed_block*>(calloc(1, sizeof(struct backed_block)));
  if (bb == nullptr) {
    return -ENOMEM;
  }

  bb->block = block;
  bb->len = len;
  bb->type = BACKED_BLOCK_FILE;
  bb->file.filename = strdup(filename);
  bb->file.offset = offset;
  bb->next = nullptr;

  return queue_bb(bbl, bb);
}